

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_progress_handler(sqlite3 *db,int nOps,_func_int_void_ptr *xProgress,void *pArg)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x14b2e9);
  if (in_ESI < 1) {
    *(undefined8 *)(in_RDI + 0x208) = 0;
    *(undefined4 *)(in_RDI + 0x218) = 0;
    *(undefined8 *)(in_RDI + 0x210) = 0;
  }
  else {
    *(undefined8 *)(in_RDI + 0x208) = in_RDX;
    *(int *)(in_RDI + 0x218) = in_ESI;
    *(undefined8 *)(in_RDI + 0x210) = in_RCX;
  }
  sqlite3_mutex_leave((sqlite3_mutex *)0x14b360);
  return;
}

Assistant:

SQLITE_API void sqlite3_progress_handler(
  sqlite3 *db,
  int nOps,
  int (*xProgress)(void*),
  void *pArg
){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  if( nOps>0 ){
    db->xProgress = xProgress;
    db->nProgressOps = (unsigned)nOps;
    db->pProgressArg = pArg;
  }else{
    db->xProgress = 0;
    db->nProgressOps = 0;
    db->pProgressArg = 0;
  }
  sqlite3_mutex_leave(db->mutex);
}